

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.cc
# Opt level: O0

void __thiscall brown::Simulator::Simulator(Simulator *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ulong uVar4;
  int64_t *piVar5;
  int *piVar6;
  char *pcVar7;
  Simulator *this_local;
  
  this->_vptr_Simulator = (_func_int **)&PTR___cxa_pure_virtual_0010fd50;
  this->BMPXRES = 800;
  this->BMPYRES = 800;
  this->CLKFRQ = 100000000;
  this->PULPERPIX = 0x40;
  this->MAXACC = 640000;
  this->MAXVEL = 10000;
  this->MINVEL = 1000;
  this->MINPOS = -0x6400;
  this->MAXPOS = 0x6400;
  this->MAXT = 100000;
  this->MINT = 10000;
  this->FIFMAX = 0x1000000;
  Tile::Tile(&this->drawing,800,800,0);
  this->pclk = -1;
  this->oclk[0] = -1;
  this->oclk[1] = -1;
  this->ooclk[0] = -2;
  this->ooclk[1] = -2;
  this->odir[0] = 0;
  this->odir[1] = 0;
  this->odown = false;
  this->killax[0] = false;
  this->killax[1] = false;
  this->cur[0] = 0;
  this->cur[1] = 0;
  this->acur[0] = 0;
  this->acur[1] = 0;
  this->fault = 0;
  this->faultclk = 0;
  this->fifn = 0;
  this->pulcount[0] = 0;
  this->pulcount[1] = 0;
  this->xoff = 0;
  this->zoom = 1000000;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = this->FIFMAX;
  uVar4 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  piVar5 = (int64_t *)operator_new__(uVar4);
  this->fifclk = piVar5;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = this->FIFMAX;
  uVar4 = SUB168(auVar2 * ZEXT816(4),0);
  if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  piVar6 = (int *)operator_new__(uVar4);
  this->fifcurx = piVar6;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = this->FIFMAX;
  uVar4 = SUB168(auVar3 * ZEXT816(4),0);
  if (SUB168(auVar3 * ZEXT816(4),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  piVar6 = (int *)operator_new__(uVar4);
  this->fifcury = piVar6;
  pcVar7 = (char *)operator_new__(this->FIFMAX);
  this->fifbit = pcVar7;
  return;
}

Assistant:

Simulator::Simulator():
    BMPXRES(BMPXRES_), BMPYRES(BMPYRES_),
    CLKFRQ(CLKFRQ_), PULPERPIX(PULPERPIX_), MAXACC(MAXACC_),
    MAXVEL(MAXVEL_), MINVEL(MINVEL_),
    MINPOS(MINPOS_), MAXPOS(MAXPOS_),
    MAXT(CLKFRQ_/MINVEL_), MINT(CLKFRQ_/MAXVEL_),
    FIFMAX(FIFMAX_),
    drawing(BMPXRES_, BMPYRES_, BACKGROUND_COLOR) {
    fifclk = new std::int64_t[FIFMAX];
    fifcurx = new int[FIFMAX];
    fifcury = new int[FIFMAX];
    fifbit = new char[FIFMAX];
}